

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateLoopContinueBreakLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  pointer pcVar3;
  bool bVar4;
  long *plVar5;
  undefined8 *puVar6;
  long *plVar7;
  ulong *puVar8;
  Result r;
  string err;
  pointer local_e0;
  _Alloc_hider local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  ulong *local_98;
  long local_90;
  ulong local_88;
  long lStack_80;
  long *local_78 [2];
  long local_68 [2];
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  undefined1 local_48 [24];
  
  Result::Result((Result *)&local_e0);
  validateInputCount((Result *)local_58,layer,0,0);
  local_e0 = (pointer)local_58;
  std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_50);
  if (local_50._M_p != local_48 + 8) {
    operator_delete(local_50._M_p,local_48._8_8_ + 1);
  }
  bVar4 = Result::good((Result *)&local_e0);
  if (bVar4) {
    local_90 = 0;
    local_88 = local_88 & 0xffffffffffffff00;
    local_98 = &local_88;
    Result::Result((Result *)local_58);
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    local_e0 = (pointer)local_58;
    std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_50);
    if (local_50._M_p != local_48 + 8) {
      operator_delete(local_50._M_p,local_48._8_8_ + 1);
    }
  }
  bVar4 = Result::good((Result *)&local_e0);
  if ((bVar4) && (this->loopStackDepth == 0)) {
    local_50._M_p = (pointer)0x0;
    local_48[0] = '\0';
    local_58 = (undefined1  [8])local_48;
    if (layer->_oneof_case_[0] == 0x26c) {
      psVar2 = (layer->name_).ptr_;
      local_78[0] = local_68;
      pcVar3 = (psVar2->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_78,pcVar3,pcVar3 + psVar2->_M_string_length);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)local_78,0,(char *)0x0,0x630037);
      local_b8 = &local_a8;
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_a8 = *plVar7;
        lStack_a0 = plVar5[3];
      }
      else {
        local_a8 = *plVar7;
        local_b8 = (long *)*plVar5;
      }
      local_b0 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_b8);
    }
    else {
      psVar2 = (layer->name_).ptr_;
      local_78[0] = local_68;
      pcVar3 = (psVar2->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_78,pcVar3,pcVar3 + psVar2->_M_string_length);
      puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)local_78,0,(char *)0x0,0x63007c);
      local_b8 = &local_a8;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_a8 = *plVar5;
        lStack_a0 = puVar6[3];
      }
      else {
        local_a8 = *plVar5;
        local_b8 = (long *)*puVar6;
      }
      local_b0 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_b8);
    }
    puVar8 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar8) {
      local_88 = *puVar8;
      lStack_80 = plVar5[3];
      local_98 = &local_88;
    }
    else {
      local_88 = *puVar8;
      local_98 = (ulong *)*plVar5;
    }
    local_90 = plVar5[1];
    *plVar5 = (long)puVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_58,(string *)&local_98);
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    if (local_78[0] != local_68) {
      operator_delete(local_78[0],local_68[0] + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_58);
    if (local_58 != (undefined1  [8])local_48) {
      operator_delete((void *)local_58,CONCAT71(local_48._1_7_,local_48[0]) + 1);
    }
  }
  else {
    *(pointer *)__return_storage_ptr__ = local_e0;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_p == &local_c8) {
      paVar1->_M_allocated_capacity =
           CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]);
      *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_c8._8_8_;
    }
    else {
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_d8._M_p;
      (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
           CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]);
    }
    (__return_storage_ptr__->m_message)._M_string_length = local_d0;
    local_d0 = 0;
    local_c8._M_local_buf[0] = '\0';
    local_d8._M_p = (pointer)&local_c8;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_p != &local_c8) {
    operator_delete(local_d8._M_p,
                    CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateLoopContinueBreakLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 0, 0);
    if (r.good()) {
        r = validateOutputCount(layer, 0, 0);
    }
    if (!r.good()) {
        return r;
    }

    if (loopStackDepth == 0) {
        std::string err;
        if (layer.layer_case() == Specification::NeuralNetworkLayer::LayerCase::kLoopBreak) {
            err = "Loop Break Layer '" + std::string(layer.name()) + "' must be inside the bodyNetwork of a loop layer.";
        } else {
            err = "Loop Continue Layer '" + std::string(layer.name()) + "' must be inside the bodyNetwork of a loop layer.";
        }
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    return r;
}